

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

string __thiscall mjs::global_object_impl::common_string(global_object_impl *this,char *str)

{
  gc_heap *name;
  string sVar1;
  char *str_local;
  global_object_impl *this_local;
  
  name = object::heap((object *)str);
  sVar1 = anon_unknown_35::string_cache::get
                    ((string_cache *)this,(gc_heap *)(str + 0x70),(char *)name);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string common_string(const char* str) override {
        return string_cache_.get(heap(), str);
    }